

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O2

void __thiscall bandit::reporter::xunit::~xunit(xunit *this)

{
  (this->super_progress_base).super_interface._vptr_interface = (_func_int **)&PTR__xunit_0011b578;
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->work_stm_);
  progress_base::~progress_base(&this->super_progress_base);
  return;
}

Assistant:

xunit(std::ostream& stm, const detail::failure_formatter_t& formatter)
          : progress_base(formatter), stm_(stm) {}